

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void free_exporter_master_secret(ptls_t *tls,int is_early)

{
  uint8_t *local_28;
  uint8_t *slot;
  int is_early_local;
  ptls_t *tls_local;
  
  if (is_early == 0) {
    local_28 = (tls->exporter_master_secret).one_rtt;
  }
  else {
    local_28 = (tls->exporter_master_secret).early;
  }
  if (local_28 != (uint8_t *)0x0) {
    if (tls->key_schedule == (st_ptls_key_schedule_t *)0x0) {
      __assert_fail("tls->key_schedule != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/picotls/lib/picotls.c"
                    ,0x360,"void free_exporter_master_secret(ptls_t *, int)");
    }
    (*ptls_clear_memory)(local_28,(tls->key_schedule->hashes[0].algo)->digest_size);
    free(local_28);
  }
  return;
}

Assistant:

static void free_exporter_master_secret(ptls_t *tls, int is_early)
{
    uint8_t *slot = is_early ? tls->exporter_master_secret.early : tls->exporter_master_secret.one_rtt;
    if (slot == NULL)
        return;
    assert(tls->key_schedule != NULL);
    ptls_clear_memory(slot, tls->key_schedule->hashes[0].algo->digest_size);
    free(slot);
}